

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

void testing::internal::UniversalTersePrinter<const_wchar_t_*>::Print(wchar_t *str,ostream *os)

{
  long in_FS_OFFSET;
  allocator local_41;
  wstring local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (str == (wchar_t *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      std::operator<<(os,"NULL");
      return;
    }
  }
  else {
    std::__cxx11::wstring::wstring((wstring *)&local_40,str,&local_41);
    PrintWideStringTo(&local_40,os);
    std::__cxx11::wstring::~wstring((wstring *)&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void Print(const wchar_t* str, ::std::ostream* os) {
                if (str == NULL) {
                    *os << "NULL";
                }
                else {
                    UniversalPrint(::std::wstring(str), os);
                }
            }